

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::writeToBinary(Binasc *this,ostream *out,string *infile)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  ifstream input;
  
  std::ifstream::ifstream(&input);
  std::ifstream::open((char *)&input,(_Ios_Openmode)(infile->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot open ");
    poVar3 = std::operator<<(poVar3,(string *)infile);
    poVar3 = std::operator<<(poVar3," for reading in binasc.");
    iVar2 = 0;
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    iVar2 = writeToBinary(this,out,(istream *)&input);
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&input);
  return iVar2;
}

Assistant:

int Binasc::writeToBinary(std::ostream& out, const std::string& infile) {
	std::ifstream input;
	input.open(infile.c_str());
	if (!input.is_open()) {
		std::cerr << "Cannot open " << infile
		          << " for reading in binasc." << std::endl;
		return 0;
	}

	int status = writeToBinary(out, input);
	input.close();
	return status;
}